

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::requireVertexPrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  int *piVar1;
  
  piVar1 = &(this->vertexPrincipalCurvatureDirectionsQ).super_DependentQuantity.requireCount;
  *piVar1 = *piVar1 + 1;
  if ((this->vertexPrincipalCurvatureDirectionsQ).super_DependentQuantity.computed == false) {
    if ((this->vertexPrincipalCurvatureDirectionsQ).super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->vertexPrincipalCurvatureDirectionsQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)
               &(this->vertexPrincipalCurvatureDirectionsQ).super_DependentQuantity.evaluateFunc);
    (this->vertexPrincipalCurvatureDirectionsQ).super_DependentQuantity.computed = true;
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::unrequireEdgeDihedralAngles() { edgeDihedralAnglesQ.unrequire(); }